

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O3

vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_> *
google::protobuf::MapTestUtil::GetMapEntriesFromRelease<proto2_unittest::TestMap>
          (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
           *__return_storage_ptr__,TestMap *message)

{
  Descriptor *this;
  FieldDescriptor *pFVar1;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  Metadata MVar2;
  Message *local_28;
  
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  this = MVar2.descriptor;
  (__return_storage_ptr__->
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name._M_str = "map_int32_int32";
  name._M_len = 0xf;
  pFVar1 = Descriptor::FindFieldByName(this,name);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_00._M_str = "map_int64_int64";
  name_00._M_len = 0xf;
  pFVar1 = Descriptor::FindFieldByName(this,name_00);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_01._M_str = "map_uint32_uint32";
  name_01._M_len = 0x11;
  pFVar1 = Descriptor::FindFieldByName(this,name_01);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_02._M_str = "map_uint64_uint64";
  name_02._M_len = 0x11;
  pFVar1 = Descriptor::FindFieldByName(this,name_02);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_03._M_str = "map_sint32_sint32";
  name_03._M_len = 0x11;
  pFVar1 = Descriptor::FindFieldByName(this,name_03);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_04._M_str = "map_sint64_sint64";
  name_04._M_len = 0x11;
  pFVar1 = Descriptor::FindFieldByName(this,name_04);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_05._M_str = "map_fixed32_fixed32";
  name_05._M_len = 0x13;
  pFVar1 = Descriptor::FindFieldByName(this,name_05);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_06._M_str = "map_fixed64_fixed64";
  name_06._M_len = 0x13;
  pFVar1 = Descriptor::FindFieldByName(this,name_06);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_07._M_str = "map_sfixed32_sfixed32";
  name_07._M_len = 0x15;
  pFVar1 = Descriptor::FindFieldByName(this,name_07);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_08._M_str = "map_sfixed64_sfixed64";
  name_08._M_len = 0x15;
  pFVar1 = Descriptor::FindFieldByName(this,name_08);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_09._M_str = "map_int32_float";
  name_09._M_len = 0xf;
  pFVar1 = Descriptor::FindFieldByName(this,name_09);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_10._M_str = "map_int32_double";
  name_10._M_len = 0x10;
  pFVar1 = Descriptor::FindFieldByName(this,name_10);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_11._M_str = "map_bool_bool";
  name_11._M_len = 0xd;
  pFVar1 = Descriptor::FindFieldByName(this,name_11);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_12._M_str = "map_string_string";
  name_12._M_len = 0x11;
  pFVar1 = Descriptor::FindFieldByName(this,name_12);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_13._M_str = "map_int32_bytes";
  name_13._M_len = 0xf;
  pFVar1 = Descriptor::FindFieldByName(this,name_13);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_14._M_str = "map_int32_enum";
  name_14._M_len = 0xe;
  pFVar1 = Descriptor::FindFieldByName(this,name_14);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  MVar2 = proto2_unittest::TestMap::GetMetadata
                    ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  name_15._M_str = "map_int32_foreign_message";
  name_15._M_len = 0x19;
  pFVar1 = Descriptor::FindFieldByName(this,name_15);
  local_28 = Reflection::ReleaseLast(MVar2.reflection,&message->super_Message,pFVar1);
  std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
  emplace_back<google::protobuf::Message_const*>
            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
              *)__return_storage_ptr__,&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Message*> MapTestUtil::GetMapEntriesFromRelease(
    TestMap* message) {
  const Descriptor* descriptor = message->GetDescriptor();
  std::vector<const Message*> result;

  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int32_int32")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int64_int64")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_uint32_uint32")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_uint64_uint64")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_sint32_sint32")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_sint64_sint64")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_fixed32_fixed32")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_fixed64_fixed64")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_sfixed32_sfixed32")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_sfixed64_sfixed64")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int32_float")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int32_double")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_bool_bool")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_string_string")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int32_bytes")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int32_enum")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int32_foreign_message")));

  return result;
}